

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int findNextHostParameter(char *zSql,int *pnToken)

{
  int iVar1;
  int local_20;
  int n;
  int nTotal;
  int tokenType;
  int *pnToken_local;
  char *zSql_local;
  
  local_20 = 0;
  *pnToken = 0;
  _nTotal = pnToken;
  pnToken_local = (int *)zSql;
  while( true ) {
    if ((char)*pnToken_local == '\0') {
      return local_20;
    }
    iVar1 = sqlite3GetToken((uchar *)pnToken_local,&n);
    if (n == 0x94) break;
    local_20 = iVar1 + local_20;
    pnToken_local = (int *)((long)pnToken_local + (long)iVar1);
  }
  *_nTotal = iVar1;
  return local_20;
}

Assistant:

static int findNextHostParameter(const char *zSql, int *pnToken){
  int tokenType;
  int nTotal = 0;
  int n;

  *pnToken = 0;
  while( zSql[0] ){
    n = sqlite3GetToken((u8*)zSql, &tokenType);
    assert( n>0 && tokenType!=TK_ILLEGAL );
    if( tokenType==TK_VARIABLE ){
      *pnToken = n;
      break;
    }
    nTotal += n;
    zSql += n;
  }
  return nTotal;
}